

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void PrintFunction(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule,
                  RegVmLoweredFunction *lowFunction)

{
  FunctionData *pFVar1;
  ScopeData *pSVar2;
  VariableData *pVVar3;
  VmConstant *pVVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  ArgumentData *pAVar8;
  VariableData **ppVVar9;
  VmConstant **ppVVar10;
  VmValue **ppVVar11;
  VmInstruction *pVVar12;
  RegVmLoweredBlock **ppRVar13;
  char *pcVar14;
  char *pcVar15;
  uint local_78;
  uint i_3;
  bool simpleUse;
  VmInstruction *inst;
  uint k;
  VmConstant *user;
  uint i_2;
  bool addressTaken;
  VariableData *variable;
  uint i_1;
  ScopeData *scope;
  ArgumentData *argument;
  uint i;
  FunctionData *fData;
  RegVmLoweredFunction *lowFunction_local;
  RegVmLoweredModule *lowModule_local;
  InstructionRegVmLowerGraphContext *ctx_local;
  
  pFVar1 = lowFunction->vmFunction->function;
  if (pFVar1 == (FunctionData *)0x0) {
    PrintLine(ctx->output,"function global()");
  }
  else {
    Print(ctx->output,"function %.*s.f%04x(",
          (ulong)(uint)((int)(pFVar1->name->name).end - (int)(pFVar1->name->name).begin),
          (pFVar1->name->name).begin,(ulong)pFVar1->uniqueId);
    for (argument._4_4_ = 0; uVar7 = SmallArray<ArgumentData,_4U>::size(&pFVar1->arguments),
        argument._4_4_ < uVar7; argument._4_4_ = argument._4_4_ + 1) {
      pAVar8 = SmallArray<ArgumentData,_4U>::operator[](&pFVar1->arguments,argument._4_4_);
      pcVar15 = ", ";
      if (argument._4_4_ == 0) {
        pcVar15 = "";
      }
      pcVar14 = "";
      if ((pAVar8->isExplicit & 1U) != 0) {
        pcVar14 = "explicit ";
      }
      Print(ctx->output,"%s%s%.*s %.*s",pcVar15,pcVar14,
            (ulong)(uint)((int)(pAVar8->type->name).end - (int)(pAVar8->type->name).begin),
            (pAVar8->type->name).begin,
            (int)(pAVar8->name->name).end - (int)(pAVar8->name->name).begin,
            (pAVar8->name->name).begin);
    }
    PrintLine(ctx->output,")");
    PrintLine(ctx->output,"// argument size %lld",pFVar1->argumentsSize);
    PrintLine(ctx->output,"// stack size %lld",pFVar1->stackSize);
    PrintLine(ctx->output,"// register count %d (r0-r%d)",(ulong)pFVar1->vmFunction->regVmRegisters,
              (ulong)(pFVar1->vmFunction->regVmRegisters - 1));
  }
  pSVar2 = lowFunction->vmFunction->scope;
  if (pSVar2 != (ScopeData *)0x0) {
    for (variable._4_4_ = 0; uVar7 = SmallArray<VariableData_*,_4U>::size(&pSVar2->allVariables),
        variable._4_4_ < uVar7; variable._4_4_ = variable._4_4_ + 1) {
      ppVVar9 = SmallArray<VariableData_*,_4U>::operator[](&pSVar2->allVariables,variable._4_4_);
      pVVar3 = *ppVVar9;
      if (((pVVar3->isAlloca & 1U) == 0) ||
         (bVar6 = SmallArray<VmConstant_*,_8U>::empty(&pVVar3->users), !bVar6)) {
        pcVar15 = "";
        if (pVVar3->importModule != (ModuleData *)0x0) {
          pcVar15 = "imported ";
        }
        Print(ctx->output,"// %s0x%x: %.*s %.*s",pcVar15,(ulong)pVVar3->offset,
              (ulong)(uint)((int)(pVVar3->type->name).end - (int)(pVVar3->type->name).begin),
              (pVVar3->type->name).begin,
              (int)(pVVar3->name->name).end - (int)(pVVar3->name->name).begin,
              (pVVar3->name->name).begin);
        bVar6 = false;
        for (user._0_4_ = 0; uVar7 = SmallArray<VmConstant_*,_8U>::size(&pVVar3->users),
            (uint)user < uVar7; user._0_4_ = (uint)user + 1) {
          ppVVar10 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar3->users,(uint)user);
          pVVar4 = *ppVVar10;
          for (inst._4_4_ = 0;
              uVar7 = SmallArray<VmValue_*,_8U>::size(&(pVVar4->super_VmValue).users),
              inst._4_4_ < uVar7; inst._4_4_ = inst._4_4_ + 1) {
            ppVVar11 = SmallArray<VmValue_*,_8U>::operator[]
                                 (&(pVVar4->super_VmValue).users,inst._4_4_);
            pVVar12 = getType<VmInstruction>(*ppVVar11);
            if (pVVar12 == (VmInstruction *)0x0) {
              __assert_fail("!\"invalid constant use\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                            ,0x3a3,
                            "void PrintFunction(InstructionRegVmLowerGraphContext &, RegVmLoweredModule *, RegVmLoweredFunction *)"
                           );
            }
            if (((int)pVVar12->cmd < 0) || (6 < (int)pVVar12->cmd)) {
              if (((int)pVVar12->cmd < 8) ||
                 ((0xe < (int)pVVar12->cmd ||
                  (ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,0),
                  (VmConstant *)*ppVVar11 != pVVar4)))) {
                if ((pVVar12->cmd == VM_INST_MEM_COPY) &&
                   ((ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,0),
                    (VmConstant *)*ppVVar11 == pVVar4 ||
                    (ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,2),
                    (VmConstant *)*ppVVar11 == pVVar4)))) {
                  bVar5 = true;
                }
                else if ((pVVar12->cmd == VM_INST_SET_RANGE) &&
                        (ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,0),
                        (VmConstant *)*ppVVar11 == pVVar4)) {
                  bVar5 = true;
                }
                else if (((pVVar12->cmd == VM_INST_RETURN) || (pVVar12->cmd == VM_INST_CALL)) &&
                        ((pVVar4->isReference & 1U) != 0)) {
                  bVar5 = true;
                }
                else if ((((int)pVVar12->cmd < 0x33) || (0x43 < (int)pVVar12->cmd)) ||
                        (ppVVar11 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,1),
                        (VmConstant *)*ppVVar11 != pVVar4)) {
                  bVar5 = false;
                }
                else {
                  bVar5 = true;
                }
              }
              else {
                bVar5 = true;
              }
            }
            else {
              bVar5 = true;
            }
            if (!bVar5) {
              bVar6 = true;
            }
          }
        }
        if (!bVar6) {
          Print(ctx->output," noalias");
        }
        if ((pVVar3->isAlloca & 1U) != 0) {
          Print(ctx->output," alloca");
        }
        if (pVVar3->importModule != (ModuleData *)0x0) {
          Print(ctx->output," from \'%.*s\'",
                (ulong)(uint)((int)(pVVar3->importModule->name).end -
                             (int)(pVVar3->importModule->name).begin),
                (pVVar3->importModule->name).begin);
        }
        PrintLine(ctx->output);
      }
    }
  }
  PrintLine(ctx->output,"{");
  for (local_78 = 0; uVar7 = SmallArray<RegVmLoweredBlock_*,_16U>::size(&lowFunction->blocks),
      local_78 < uVar7; local_78 = local_78 + 1) {
    ppRVar13 = SmallArray<RegVmLoweredBlock_*,_16U>::operator[](&lowFunction->blocks,local_78);
    PrintBlock(ctx,lowModule,*ppRVar13);
  }
  PrintLine(ctx->output,"}");
  PrintLine(ctx->output);
  return;
}

Assistant:

void PrintFunction(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule, RegVmLoweredFunction *lowFunction)
{
	if(FunctionData *fData = lowFunction->vmFunction->function)
	{
		Print(ctx.output, "function %.*s.f%04x(", FMT_ISTR(fData->name->name), fData->uniqueId);

		for(unsigned i = 0; i < fData->arguments.size(); i++)
		{
			ArgumentData &argument = fData->arguments[i];

			Print(ctx.output, "%s%s%.*s %.*s", i == 0 ? "" : ", ", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name), FMT_ISTR(argument.name->name));
		}

		PrintLine(ctx.output, ")");

		PrintLine(ctx.output, "// argument size %lld", fData->argumentsSize);
		PrintLine(ctx.output, "// stack size %lld", fData->stackSize);
		PrintLine(ctx.output, "// register count %d (r0-r%d)", fData->vmFunction->regVmRegisters, fData->vmFunction->regVmRegisters - 1);
	}
	else
	{
		PrintLine(ctx.output, "function global()");
	}

	if(ScopeData *scope = lowFunction->vmFunction->scope)
	{
		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			Print(ctx.output, "// %s0x%x: %.*s %.*s", variable->importModule ? "imported " : "", variable->offset, FMT_ISTR(variable->type->name), FMT_ISTR(variable->name->name));

			bool addressTaken = false;

			for(unsigned i = 0; i < variable->users.size(); i++)
			{
				VmConstant *user = variable->users[i];

				for(unsigned k = 0; k < user->users.size(); k++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[k]))
					{
						bool simpleUse = false;

						if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
							simpleUse = true;
						else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
							simpleUse = true;
						else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
							simpleUse = true;
						else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
							simpleUse = true;
						else if((inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL) && user->isReference)
							simpleUse = true;
						else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
							simpleUse = true;
						else
							simpleUse = false;

						if(!simpleUse)
							addressTaken = true;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}
			}

			if(!addressTaken)
				Print(ctx.output, " noalias");

			if(variable->isAlloca)
				Print(ctx.output, " alloca");

			if(variable->importModule)
				Print(ctx.output, " from '%.*s'", FMT_ISTR(variable->importModule->name));

			PrintLine(ctx.output);
		}
	}

	PrintLine(ctx.output, "{");

	for(unsigned i = 0; i < lowFunction->blocks.size(); i++)
		PrintBlock(ctx, lowModule, lowFunction->blocks[i]);

	PrintLine(ctx.output, "}");
	PrintLine(ctx.output);
}